

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O0

void __thiscall
duckdb::RowGroup::UpdateColumn
          (RowGroup *this,TransactionData transaction,DataChunk *updates,Vector *row_ids,
          vector<unsigned_long,_true> *column_path)

{
  long *plVar1;
  ColumnData *pCVar2;
  reference pvVar3;
  idx_t iVar4;
  undefined8 in_RCX;
  DataChunk *in_RSI;
  RowGroup *in_RDI;
  undefined4 in_stack_00000008;
  undefined8 in_stack_00000010;
  idx_t in_stack_00000018;
  ColumnData *col_data;
  value_type primary_column_idx;
  long *ids;
  storage_t in_stack_00000170;
  RowGroup *in_stack_00000178;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  
  plVar1 = FlatVector::GetData<long>((Vector *)0xbab0ee);
  vector<unsigned_long,_true>::operator[]
            ((vector<unsigned_long,_true> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  pCVar2 = GetColumn(in_stack_00000178,in_stack_00000170);
  pvVar3 = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)
                      CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  iVar4 = DataChunk::size(in_RSI);
  uStack_50 = (undefined4)in_stack_00000010;
  uStack_4c = (undefined4)((ulong)in_stack_00000010 >> 0x20);
  (*pCVar2->_vptr_ColumnData[0x18])(pCVar2,in_RCX,pvVar3,plVar1,iVar4,1,in_stack_00000008);
  (*pCVar2->_vptr_ColumnData[0x19])();
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::operator*
            ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              *)CONCAT44(uStack_4c,uStack_50));
  MergeStatistics(in_RDI,in_stack_00000018,(BaseStatistics *)CONCAT44(uStack_4c,uStack_50));
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::~unique_ptr
            ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              *)0xbab23b);
  return;
}

Assistant:

void RowGroup::UpdateColumn(TransactionData transaction, DataChunk &updates, Vector &row_ids,
                            const vector<column_t> &column_path) {
	D_ASSERT(updates.ColumnCount() == 1);
	auto ids = FlatVector::GetData<row_t>(row_ids);

	auto primary_column_idx = column_path[0];
	D_ASSERT(primary_column_idx != COLUMN_IDENTIFIER_ROW_ID);
	D_ASSERT(primary_column_idx < columns.size());
	auto &col_data = GetColumn(primary_column_idx);
	col_data.UpdateColumn(transaction, column_path, updates.data[0], ids, updates.size(), 1);
	MergeStatistics(primary_column_idx, *col_data.GetUpdateStatistics());
}